

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_common.c
# Opt level: O0

StringCache * stringcache_create(void)

{
  StringBucket **ppSVar1;
  StringCache *cache;
  size_t tablelen;
  StringCache *pSStack_10;
  uint32 initial_table_size;
  
  pSStack_10 = (StringCache *)malloc(0x18);
  if (pSStack_10 == (StringCache *)0x0) {
    pSStack_10 = (StringCache *)0x0;
  }
  else {
    memset(pSStack_10,0,0x18);
    ppSVar1 = (StringBucket **)malloc(0x800);
    pSStack_10->hashtable = ppSVar1;
    if (pSStack_10->hashtable == (StringBucket **)0x0) {
      free(pSStack_10);
      pSStack_10 = (StringCache *)0x0;
    }
    else {
      memset(pSStack_10->hashtable,0,0x800);
      pSStack_10->table_size = 0x100;
    }
  }
  return pSStack_10;
}

Assistant:

StringCache *stringcache_create(void)
{
    const uint32 initial_table_size = 256;
    const size_t tablelen = sizeof (StringBucket *) * initial_table_size;
    StringCache *cache = (StringCache *) malloc(sizeof (StringCache));
    if (!cache) {
        return NULL;
    }
    memset(cache, '\0', sizeof (StringCache));

    cache->hashtable = (StringBucket **) malloc(tablelen);
    if (!cache->hashtable)
    {
        free(cache);
        return NULL;
    }
    memset(cache->hashtable, '\0', tablelen);

    cache->table_size = initial_table_size;
    return cache;
}